

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleElement.cpp
# Opt level: O0

void __thiscall DoubleElement::DoubleElement(DoubleElement *this)

{
  allocator<char> local_31;
  string local_30;
  DoubleElement *local_10;
  DoubleElement *this_local;
  
  local_10 = this;
  StreamObject::StreamObject(&this->super_StreamObject);
  (this->super_StreamObject)._vptr_StreamObject = (_func_int **)&PTR_write_00111c38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"DoubleElement",&local_31);
  StreamObject::setName(&this->super_StreamObject,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

DoubleElement::DoubleElement( )
{
	setName( "DoubleElement" );
}